

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_wal_hook(sqlite3 *db,_func_int_void_ptr_sqlite3_ptr_char_ptr_int *xCallback,
                       void *pArg)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *pRet;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c784);
  pvVar1 = *(void **)(in_RDI + 0x168);
  *(undefined8 *)(in_RDI + 0x160) = in_RSI;
  *(undefined8 *)(in_RDI + 0x168) = in_RDX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c7c5);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_wal_hook(
  sqlite3 *db,                    /* Attach the hook to this db handle */
  int(*xCallback)(void *, sqlite3*, const char*, int),
  void *pArg                      /* First argument passed to xCallback() */
){
#ifndef SQLITE_OMIT_WAL
  void *pRet;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pRet = db->pWalArg;
  db->xWalCallback = xCallback;
  db->pWalArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pRet;
#else
  return 0;
#endif
}